

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

void __thiscall w3SourceGen::push_i32(w3SourceGen *this,int i)

{
  char *__s;
  allocator<char> local_a1;
  undefined1 local_a0 [8];
  w3SourceGenValue sourceGenValue;
  char s [99];
  int i_local;
  w3SourceGen *this_local;
  
  __s = sourceGenValue.str.field_2._M_local_buf + 8;
  sprintf(__s,"%d",(ulong)(uint)i);
  local_a0[0] = Tag_i32;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&sourceGenValue,__s,&local_a1);
  std::allocator<char>::~allocator(&local_a1);
  std::stack<w3SourceGenValue,_std::deque<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>_>::
  push(&(this->stack).
        super_stack<w3SourceGenValue,_std::deque<w3SourceGenValue,_std::allocator<w3SourceGenValue>_>_>
       ,(value_type *)local_a0);
  w3SourceGenValue::~w3SourceGenValue((w3SourceGenValue *)local_a0);
  return;
}

Assistant:

void push_i32 (int i)
    {
        char s[99];
        sprintf(s, "%d", i); // TODO C vs. Rust TODO perf
        w3SourceGenValue sourceGenValue = {Tag_i32, s};
        stack.push(sourceGenValue);
    }